

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

uint64_t __thiscall
mkvmuxer::Segment::AddAudioTrack(Segment *this,int32_t sample_rate,int32_t channels,int32_t number)

{
  bool bVar1;
  AudioTrack *this_00;
  
  this_00 = (AudioTrack *)operator_new(0x90,(nothrow_t *)&std::nothrow);
  if (this_00 != (AudioTrack *)0x0) {
    AudioTrack::AudioTrack(this_00,&this->seed_);
    (this_00->super_Track).type_ = 2;
    Track::set_codec_id((Track *)this_00,"A_VORBIS");
    this_00->sample_rate_ = (double)sample_rate;
    this_00->channels_ = (long)channels;
    bVar1 = Tracks::AddTrack(&this->tracks_,(Track *)this_00,number);
    if (bVar1) {
      return (this_00->super_Track).number_;
    }
    (*(this_00->super_Track)._vptr_Track[1])(this_00);
  }
  return 0;
}

Assistant:

uint64_t Segment::AddAudioTrack(int32_t sample_rate, int32_t channels,
                                int32_t number) {
  AudioTrack* const track = new (std::nothrow) AudioTrack(&seed_);  // NOLINT
  if (!track)
    return 0;

  track->set_type(Tracks::kAudio);
  track->set_codec_id(Tracks::kVorbisCodecId);
  track->set_sample_rate(sample_rate);
  track->set_channels(channels);

  if (!tracks_.AddTrack(track, number)) {
    delete track;
    return 0;
  }

  return track->number();
}